

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O0

void test_usleep(void)

{
  Step SVar1;
  int iVar2;
  uint64_t in_stack_00000008;
  LockstepScheduler *in_stack_00000010;
  thread thread;
  atomic<Step> step;
  LockstepScheduler ls;
  Step in_stack_ffffffffffffff7c;
  atomic<Step> *this;
  LockstepScheduler *in_stack_ffffffffffffff90;
  type *in_stack_ffffffffffffffa8;
  thread *in_stack_ffffffffffffffb0;
  uint64_t in_stack_ffffffffffffffd8;
  LockstepScheduler *in_stack_ffffffffffffffe0;
  
  this = (atomic<Step> *)&stack0xffffffffffffffb0;
  LockstepScheduler::LockstepScheduler(in_stack_ffffffffffffff90);
  LockstepScheduler::set_absolute_time(in_stack_00000010,in_stack_00000008);
  std::thread::thread<test_usleep()::__0,,void>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  while( true ) {
    SVar1 = std::atomic::operator_cast_to_Step((atomic<Step> *)0x10fef0);
    if (SVar1 == ThreadStarted) break;
    std::this_thread::yield();
  }
  std::atomic<Step>::operator=(this,in_stack_ffffffffffffff7c);
  iVar2 = LockstepScheduler::usleep_until(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (iVar2 == 0) {
    SVar1 = std::atomic::operator_cast_to_Step((atomic<Step> *)0x10ff8a);
    if (SVar1 == UsleepTriggered) {
      std::thread::join();
      std::thread::~thread((thread *)0x10ffc6);
      LockstepScheduler::~LockstepScheduler((LockstepScheduler *)0x10ffd0);
      return;
    }
    __assert_fail("step == Step::UsleepTriggered",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/julianoes[P]lockstep-scheduler/test/src/lockstep_scheduler_test.cpp"
                  ,0x10e,"void test_usleep()");
  }
  __assert_fail("ls.usleep_until(some_time_us + 1000) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/julianoes[P]lockstep-scheduler/test/src/lockstep_scheduler_test.cpp"
                ,0x10d,"void test_usleep()");
}

Assistant:

void test_usleep()
{
    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);

    enum class Step {
        Init,
        ThreadStarted,
        BeforeUsleep,
        UsleepNotTriggeredYet,
        UsleepTriggered
    };

    std::atomic<Step> step{Step::Init};

    std::thread thread([&step, &ls]() {
        step = Step::ThreadStarted;

        WAIT_FOR(step == Step::BeforeUsleep);

        step = Step::UsleepNotTriggeredYet;
        ls.set_absolute_time(some_time_us + 500);

        step = Step::UsleepTriggered;
        ls.set_absolute_time(some_time_us + 1500);
    });

    WAIT_FOR(step == Step::ThreadStarted);

    step = Step::BeforeUsleep;

    assert(ls.usleep_until(some_time_us + 1000) == 0);
    assert(step == Step::UsleepTriggered);
    thread.join();
}